

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O0

void __thiscall binpac::FlowBuffer::MarkOrCopyLine(FlowBuffer *this)

{
  int iVar1;
  long in_RDI;
  FlowBuffer *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar1 = *(int *)(in_RDI + 0x38);
  if (iVar1 == 0) {
    MarkOrCopyLine_CR_OR_LF(unaff_retaddr);
  }
  else if (iVar1 == 1) {
    MarkOrCopyLine_STRICT_CRLF(unaff_retaddr);
  }
  else if (iVar1 == 3) {
    MarkOrCopyLine_LINEBREAK((FlowBuffer *)CONCAT44(3,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void FlowBuffer::MarkOrCopyLine()
	{
	switch ( linebreak_style_ )
		{
		case CR_OR_LF:
			MarkOrCopyLine_CR_OR_LF();
			break;
		case STRICT_CRLF:
			MarkOrCopyLine_STRICT_CRLF();
			break;
		case LINE_BREAKER:
			MarkOrCopyLine_LINEBREAK();
			break;
		default:
			BINPAC_ASSERT(0);
			break;
		}
	}